

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  string *psVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Type TVar7;
  EnumDescriptor *pEVar8;
  Descriptor *this_00;
  undefined1 in_CL;
  FieldDescriptor *this_01;
  string local_60;
  Options *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->descriptor_ = descriptor;
  psVar1 = &this->type_traits_;
  local_38 = &(this->type_traits_).field_2;
  (this->type_traits_)._M_dataplus._M_p = (pointer)local_38;
  (this->type_traits_)._M_string_length = 0;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  local_40 = &this->options_;
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar3 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar3,pcVar3 + (options->dllexport_decl)._M_string_length);
  bVar4 = options->table_driven_parsing;
  (this->options_).enforce_lite = options->enforce_lite;
  (this->options_).table_driven_parsing = bVar4;
  bVar4 = options->proto_h;
  bVar5 = options->transitive_pb_h;
  bVar6 = options->annotate_headers;
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  (this->options_).proto_h = bVar4;
  (this->options_).transitive_pb_h = bVar5;
  (this->options_).annotate_headers = bVar6;
  (this->options_).annotation_pragma_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_pragma_name.field_2;
  pcVar3 = (options->annotation_pragma_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_pragma_name,pcVar3,
             pcVar3 + (options->annotation_pragma_name)._M_string_length);
  (this->options_).annotation_guard_name._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_guard_name.field_2;
  pcVar3 = (options->annotation_guard_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_guard_name,pcVar3,
             pcVar3 + (options->annotation_guard_name)._M_string_length);
  this_01 = this->descriptor_;
  if (*(int *)(this_01 + 0x4c) == 3) {
    in_CL = 0xab;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->type_traits_)._M_string_length,0x39bfab);
    this_01 = this->descriptor_;
  }
  TVar7 = FieldDescriptor::type(this_01);
  iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4);
  if (iVar2 == 10) {
    std::__cxx11::string::append((char *)psVar1);
    this_00 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_60,(cpp *)this_00,(Descriptor *)0x1,(bool)in_CL);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else if (iVar2 != 9) {
    if (iVar2 == 8) {
      std::__cxx11::string::append((char *)psVar1);
      pEVar8 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_(&local_60,(cpp *)pEVar8,(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)psVar1);
      pEVar8 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_(&local_60,(cpp *)pEVar8,(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::append((char *)psVar1);
      TVar7 = FieldDescriptor::type(this->descriptor_);
      PrimitiveTypeName(*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4));
      std::__cxx11::string::append((char *)psVar1);
    }
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options)
  : descriptor_(descriptor),
    options_(options) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
}